

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

bool __thiscall
brynet::net::TcpService::helpAddChannel
          (TcpService *this,PTR channel,string *ip,ENTER_CALLBACK *enterCallback,
          DISCONNECT_CALLBACK *disConnectCallback,DATA_CALLBACK *dataCallback,
          bool forceSameThreadLoop)

{
  bool bVar1;
  bool bVar2;
  PTR *pPVar3;
  __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  anon_class_24_2_4bef2181 local_1b8;
  USER_PROC local_1a0;
  anon_class_168_7_7532e06b local_180;
  ENTER_CALLBACK local_d8;
  undefined1 local_b8 [8];
  shared_ptr<brynet::net::TcpService> shared_this;
  type loopDataCapture;
  PTR *loop;
  size_t i;
  bool find;
  lock_guard<std::mutex> local_70;
  lock_guard<std::mutex> lock;
  PTR *pPStack_60;
  int randNum;
  size_t loopIndex;
  shared_ptr<brynet::net::IOLoopData> ioLoopData;
  bool forceSameThreadLoop_local;
  DATA_CALLBACK *dataCallback_local;
  DISCONNECT_CALLBACK *disConnectCallback_local;
  ENTER_CALLBACK *enterCallback_local;
  string *ip_local;
  PTR channel_local;
  TcpService *this_local;
  
  ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = forceSameThreadLoop;
  std::shared_ptr<brynet::net::IOLoopData>::shared_ptr
            ((shared_ptr<brynet::net::IOLoopData> *)&loopIndex);
  pPStack_60 = (PTR *)0x0;
  lock._M_device._4_4_ = rand();
  std::lock_guard<std::mutex>::lock_guard(&local_70,&this->mIOLoopGuard);
  bVar1 = std::
          vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
          ::empty(&this->mIOLoopDatas);
  if (bVar1) {
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
    if ((ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      uVar7 = (ulong)lock._M_device._4_4_;
      sVar8 = std::
              vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
              ::size(&this->mIOLoopDatas);
      pPStack_60 = (PTR *)(uVar7 % sVar8);
    }
    else {
      bVar1 = false;
      for (loop = (PTR *)0x0;
          pPVar3 = (PTR *)std::
                          vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                          ::size(&this->mIOLoopDatas), loop < pPVar3;
          loop = (PTR *)((long)&(loop->
                                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + 1)) {
        this_00 = (__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                     ::operator[](&this->mIOLoopDatas,(size_type)loop);
        peVar4 = std::
                 __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        p_Var5 = (__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)IOLoopData::getEventLoop(peVar4);
        peVar6 = std::
                 __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        bVar2 = EventLoop::isInLoopThread(peVar6);
        if (bVar2) {
          pPStack_60 = loop;
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        this_local._7_1_ = 0;
        bVar1 = true;
        goto LAB_0018ba3c;
      }
    }
    pvVar9 = std::
             vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
             ::operator[](&this->mIOLoopDatas,(size_type)pPStack_60);
    std::shared_ptr<brynet::net::IOLoopData>::operator=
              ((shared_ptr<brynet::net::IOLoopData> *)&loopIndex,pvVar9);
    bVar1 = false;
  }
LAB_0018ba3c:
  std::lock_guard<std::mutex>::~lock_guard(&local_70);
  if (!bVar1) {
    peVar4 = std::
             __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&loopIndex);
    p_Var5 = (__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)IOLoopData::getEventLoop(peVar4);
    std::shared_ptr<brynet::net::IOLoopData>::shared_ptr
              ((shared_ptr<brynet::net::IOLoopData> *)
               &shared_this.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<brynet::net::IOLoopData> *)&loopIndex);
    std::enable_shared_from_this<brynet::net::TcpService>::shared_from_this
              ((enable_shared_from_this<brynet::net::TcpService> *)local_b8);
    std::__cxx11::string::string((string *)&local_180,(string *)ip);
    local_180.loopIndex = (size_t)pPStack_60;
    std::
    function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_180.enterCallback,enterCallback);
    std::function<void_(long)>::function(&local_180.disConnectCallback,disConnectCallback);
    std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
              (&local_180.dataCallback,dataCallback);
    std::shared_ptr<brynet::net::TcpService>::shared_ptr
              (&local_180.shared_this,(shared_ptr<brynet::net::TcpService> *)local_b8);
    std::shared_ptr<brynet::net::IOLoopData>::shared_ptr
              (&local_180.loopDataCapture,
               (shared_ptr<brynet::net::IOLoopData> *)
               &shared_this.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::function<void(brynet::net::DataSocket*)>::
    function<brynet::net::TcpService::helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)::__0,void>
              ((function<void(brynet::net::DataSocket*)> *)&local_d8,&local_180);
    DataSocket::setEnterCallback(channel,&local_d8);
    std::function<void_(brynet::net::DataSocket_*)>::~function(&local_d8);
    helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)
    ::$_0::~__0((__0 *)&local_180);
    peVar6 = std::
             __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    std::shared_ptr<brynet::net::EventLoop>::shared_ptr
              (&local_1b8.loop,(shared_ptr<brynet::net::EventLoop> *)p_Var5);
    local_1b8.channel = channel;
    std::function<void()>::
    function<brynet::net::TcpService::helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)::__1,void>
              ((function<void()> *)&local_1a0,&local_1b8);
    EventLoop::pushAsyncProc(peVar6,&local_1a0);
    std::function<void_()>::~function(&local_1a0);
    helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)
    ::$_1::~__1((__1 *)&local_1b8);
    this_local._7_1_ = 1;
    std::shared_ptr<brynet::net::TcpService>::~shared_ptr
              ((shared_ptr<brynet::net::TcpService> *)local_b8);
    std::shared_ptr<brynet::net::IOLoopData>::~shared_ptr
              ((shared_ptr<brynet::net::IOLoopData> *)
               &shared_this.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::shared_ptr<brynet::net::IOLoopData>::~shared_ptr
            ((shared_ptr<brynet::net::IOLoopData> *)&loopIndex);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TcpService::helpAddChannel(DataSocket::PTR channel, 
    const std::string& ip, 
    const TcpService::ENTER_CALLBACK& enterCallback, 
    const TcpService::DISCONNECT_CALLBACK& disConnectCallback, 
    const TcpService::DATA_CALLBACK& dataCallback,
    bool forceSameThreadLoop)
{
    std::shared_ptr<IOLoopData> ioLoopData;
    size_t loopIndex = 0;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);

        if (mIOLoopDatas.empty())
        {
            return false;
        }
        
        if (forceSameThreadLoop)
        {
            bool find = false;
            for (size_t i = 0; i < mIOLoopDatas.size(); i++)
            {
                if (mIOLoopDatas[i]->getEventLoop()->isInLoopThread())
                {
                    loopIndex = i;
                    find = true;
                    break;
                }
            }
            if (!find)
            {
                return false;
            }
        }
        else
        {
            loopIndex = randNum % mIOLoopDatas.size();
        }

        ioLoopData = mIOLoopDatas[loopIndex];
    }
    

    const auto& loop = ioLoopData->getEventLoop();
    auto loopDataCapture = std::move(ioLoopData);
    auto shared_this = shared_from_this();
    channel->setEnterCallback([ip, 
        loopIndex, 
        enterCallback, 
        disConnectCallback, 
        dataCallback, 
        shared_this,
        loopDataCapture](DataSocket::PTR dataSocket){
        auto id = shared_this->MakeID(loopIndex, loopDataCapture);
        union SessionId sid;
        sid.id = id;
        loopDataCapture->getDataSockets().set(dataSocket, sid.data.index);
        dataSocket->setUD(id);
        dataSocket->setDataCallback([dataCallback, 
            id](DataSocket::PTR ds, const char* buffer, size_t len){
            return dataCallback(id, buffer, len);
        });

        dataSocket->setDisConnectCallback([disConnectCallback, 
            id, 
            shared_this](DataSocket::PTR arg){
            shared_this->procDataSocketClose(arg);
            disConnectCallback(id);
            delete arg;
        });

        if (enterCallback != nullptr)
        {
            enterCallback(id, ip);
        }
    });

    //TODO::����channel �ڴ�����ȫ�ķ�ʽ
    loop->pushAsyncProc([loop, channel](){
        if (!channel->onEnterEventLoop(std::move(loop)))
        {
            delete channel;
        }
    });

    return true;
}